

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.cpp
# Opt level: O1

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::SuiteTest::result(SuiteTest *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_const_oout::Result_*,_false> _Var2;
  _List_node_base *p_Var3;
  SuiteResult *this_00;
  long *plVar4;
  long in_RSI;
  pointer __p;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  results;
  undefined1 local_a1;
  TimedTest local_a0;
  _List_node_base *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Head_base<0UL,_const_oout::Result_*,_false> local_78;
  shared_ptr<const_oout::Test> local_70;
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  local_60;
  TimedTest local_48;
  
  local_60._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_60;
  local_60._M_impl._M_node._M_size = 0;
  plVar4 = *(long **)(in_RSI + 8);
  local_78._M_head_impl = (Result *)this;
  local_60._M_impl._M_node.super__List_node_base._M_prev =
       local_60._M_impl._M_node.super__List_node_base._M_next;
  if (plVar4 != (long *)(in_RSI + 8)) {
    do {
      local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<oout::SafeTest,std::allocator<oout::SafeTest>,std::shared_ptr<oout::Test_const>const&>
                (&local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(SafeTest **)&local_a0.test,(allocator<oout::SafeTest> *)&local_a1,
                 (shared_ptr<const_oout::Test> *)(plVar4 + 2));
      local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      TimedTest::TimedTest(&local_48,&local_70);
      TimedTest::result(&local_a0);
      std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<oout::Result_const,std::default_delete<oout::Result_const>,void>
                ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)
                 &local_a0);
      p_Var3 = (_List_node_base *)operator_new(0x20);
      p_Var1 = local_80;
      p_Var3[1]._M_next = local_88;
      p_Var3[1]._M_prev = (_List_node_base *)0x0;
      local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3[1]._M_prev = (_List_node_base *)p_Var1;
      local_88 = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      local_60._M_impl._M_node._M_size = local_60._M_impl._M_node._M_size + 1;
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
      }
      if (local_a0.super_Test._vptr_Test != (_func_int **)0x0) {
        (**(code **)(*local_a0.super_Test._vptr_Test + 8))();
      }
      local_a0.super_Test._vptr_Test = (_func_int **)0x0;
      if (local_48.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.test.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      plVar4 = (long *)*plVar4;
    } while (plVar4 != (long *)(in_RSI + 8));
  }
  this_00 = (SuiteResult *)operator_new(0x20);
  SuiteResult::SuiteResult
            (this_00,(list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
                      *)&local_60);
  _Var2._M_head_impl = local_78._M_head_impl;
  local_48.super_Test._vptr_Test = (_func_int **)0x0;
  (local_78._M_head_impl)->_vptr_Result = (_func_int **)this_00;
  std::unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_>::~unique_ptr
            ((unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)&local_48);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  ::_M_clear(&local_60);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         _Var2._M_head_impl;
}

Assistant:

unique_ptr<const Result> SuiteTest::result() const
{
	list<shared_ptr<const Result>> results;
	for (const auto &c : cases) {
		results.push_back(TimedTest(make_shared<SafeTest>(c)).result());
	}
	return make_unique<SuiteResult>(results);
}